

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::HttpInputStream::Request> __thiscall
kj::anon_unknown_31::HttpInputStreamImpl::readRequest(HttpInputStreamImpl *this)

{
  TransformPromiseNodeBase *this_00;
  PromiseNode *extraout_RDX;
  _func_int **in_RSI;
  Promise<kj::HttpInputStream::Request> PVar1;
  undefined1 auStack_48 [24];
  size_t local_30;
  Own<kj::_::PromiseNode> local_28;
  
  readRequestHeaders((HttpInputStreamImpl *)auStack_48);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x30);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,(Own<kj::_::PromiseNode> *)auStack_48,
             _::
             TransformPromiseNode<kj::HttpInputStream::Request,_kj::Maybe<kj::HttpHeaders::Request>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1015:15),_kj::_::PropagateException>
             ::anon_class_8_1_8991fb9c_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00428570;
  this_00[1].super_PromiseNode._vptr_PromiseNode = in_RSI;
  auStack_48._16_8_ =
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::HttpInputStream::Request,kj::Maybe<kj::HttpHeaders::Request>,kj::(anonymous_namespace)::HttpInputStreamImpl::readRequest()::{lambda(kj::Maybe<kj::HttpHeaders::Request>&&)#1},kj::_::PropagateException>>
        ::instance;
  local_28.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::HttpInputStream::Request,kj::Maybe<kj::HttpHeaders::Request>,kj::(anonymous_namespace)::HttpInputStreamImpl::readRequest()::{lambda(kj::Maybe<kj::HttpHeaders::Request>&&)#1},kj::_::PropagateException>>
        ::instance;
  local_30 = 0;
  (this->super_HttpInputStream)._vptr_HttpInputStream =
       (_func_int **)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::HttpInputStream::Request,kj::Maybe<kj::HttpHeaders::Request>,kj::(anonymous_namespace)::HttpInputStreamImpl::readRequest()::{lambda(kj::Maybe<kj::HttpHeaders::Request>&&)#1},kj::_::PropagateException>>
        ::instance;
  this->inner = (AsyncInputStream *)this_00;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_28);
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(auStack_48 + 0x10));
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)auStack_48);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::HttpInputStream::Request>)PVar1.super_PromiseBase.node;
}

Assistant:

kj::Promise<Request> readRequest() override {
    return readRequestHeaders()
        .then([this](kj::Maybe<HttpHeaders::Request>&& maybeRequest) -> HttpInputStream::Request {
      auto request = KJ_REQUIRE_NONNULL(maybeRequest, "bad request");
      auto body = getEntityBody(HttpInputStreamImpl::REQUEST, request.method, 0, headers);

      return { request.method, request.url, headers, kj::mv(body) };
    });
  }